

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall
despot::RockSampleMMAPStateScenarioLowerBound::RockSampleMMAPStateScenarioLowerBound
          (RockSampleMMAPStateScenarioLowerBound *this,DSPOMDP *model)

{
  Grid<int> *this_00;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *__x;
  size_type sVar1;
  ulong uVar2;
  long lVar3;
  const_reference pvVar4;
  int *piVar5;
  reference this_01;
  BaseRockSample *local_98;
  undefined8 local_74;
  int local_6c;
  int local_68;
  int rock;
  ACT_TYPE action;
  int cur;
  int s;
  undefined1 local_30 [8];
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> policy;
  DSPOMDP *model_local;
  RockSampleMMAPStateScenarioLowerBound *this_local;
  
  policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)model;
  despot::ScenarioLowerBound::ScenarioLowerBound(&this->super_ScenarioLowerBound,model);
  *(undefined ***)this = &PTR__RockSampleMMAPStateScenarioLowerBound_001498e0;
  if (policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    local_98 = (BaseRockSample *)0x0;
  }
  else {
    local_98 = (BaseRockSample *)
               (policy.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + -0x38);
  }
  this->rs_model_ = local_98;
  this->grid_ = &this->rs_model_->grid_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->rock_order_);
  __x = BaseRockSample::ComputeOptimalSamplingPolicy(this->rs_model_);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_30,__x);
  sVar1 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::size
                    ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_30
                    );
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&cur + 3));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&s,sVar1,(allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&cur + 3));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&this->rock_order_,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&s);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&s);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&cur + 3));
  action = 0;
  do {
    uVar2 = (ulong)action;
    sVar1 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::size
                      ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                       local_30);
    if (sVar1 <= uVar2) {
      std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~vector
                ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_30);
      return;
    }
    rock = action;
    while( true ) {
      lVar3 = (long)rock;
      sVar1 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::size
                        ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                         local_30);
      if (lVar3 == sVar1 - 1) break;
      pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                          local_30,(long)rock);
      local_68 = *(int *)pvVar4;
      if (local_68 == 4) {
        this_00 = this->grid_;
        local_74 = BaseRockSample::IndexToCoord
                             (this->rs_model_,rock >> ((byte)this->rs_model_->num_rocks_ & 0x1f));
        piVar5 = Grid<int>::operator()(this_00,(Coord *)&local_74);
        local_6c = *piVar5;
        if (local_6c < 0) {
          exit(0);
        }
        this_01 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->rock_order_,(long)action);
        std::vector<int,_std::allocator<int>_>::push_back(this_01,&local_6c);
      }
      rock = BaseRockSample::NextState(this->rs_model_,rock,local_68);
    }
    action = action + 1;
  } while( true );
}

Assistant:

RockSampleMMAPStateScenarioLowerBound(const DSPOMDP* model) :
		ScenarioLowerBound(model),
		rs_model_(static_cast<const BaseRockSample*>(model)),
		grid_(rs_model_->grid_) {
		const vector<ValuedAction> policy =
			rs_model_->ComputeOptimalSamplingPolicy();
		rock_order_ = vector<vector<int> >(policy.size());
		for (int s = 0; s < policy.size(); s++) {
			int cur = s;
			while (cur != policy.size() - 1) {
				ACT_TYPE action = policy[cur].action;
				if (action == rs_model_->E_SAMPLE) {
					int rock = grid_(
						rs_model_->IndexToCoord(cur >> rs_model_->num_rocks_));
					if (rock < 0)
						exit(0);
					rock_order_[s].push_back(rock);
				}
				cur = rs_model_->NextState(cur, action);
			}
		}
	}